

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O0

void __thiscall
density_examples::
any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_equal>
::allocate(any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_equal>
           *this)

{
  size_t i_size;
  size_t i_alignment;
  void *pvVar1;
  any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_equal>
  *this_local;
  
  i_size = density::
           runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_equal>
           ::size(&this->m_type);
  i_alignment = density::
                runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_equal>
                ::alignment(&this->m_type);
  pvVar1 = density::aligned_allocate(i_size,i_alignment,0);
  this->m_object = pvVar1;
  return;
}

Assistant:

void allocate() { m_object = density::aligned_allocate(m_type.size(), m_type.alignment()); }